

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidateDoc(xmlRelaxNGValidCtxtPtr ctxt,xmlDocPtr doc)

{
  int ret;
  xmlDocPtr doc_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlRelaxNGValidCtxtPtr)0x0) || (doc == (xmlDocPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    ctxt->doc = doc;
    ctxt_local._4_4_ = xmlRelaxNGValidateDocument(ctxt,doc);
    xmlRelaxNGCleanPSVI((xmlNodePtr)doc);
    if (ctxt_local._4_4_ == -1) {
      ctxt_local._4_4_ = 1;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlRelaxNGValidateDoc(xmlRelaxNGValidCtxtPtr ctxt, xmlDocPtr doc)
{
    int ret;

    if ((ctxt == NULL) || (doc == NULL))
        return (-1);

    ctxt->doc = doc;

    ret = xmlRelaxNGValidateDocument(ctxt, doc);
    /*
     * Remove all left PSVI
     */
    xmlRelaxNGCleanPSVI((xmlNodePtr) doc);

    /*
     * TODO: build error codes
     */
    if (ret == -1)
        return (1);
    return (ret);
}